

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *expected_expression,char *actual_expression,string *expected_value,
          string *actual_value,bool ignoring_case)

{
  AssertionResult *pAVar1;
  int iVar2;
  size_t sVar3;
  AssertionResult *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  ostream *poVar5;
  AssertionResult AVar6;
  Message msg;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult *local_48;
  AssertionResult local_40;
  
  local_48 = (AssertionResult *)this;
  Message::Message((Message *)&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_50.ptr_ + 0x10),"Value of: ",10);
  poVar5 = (ostream *)(local_50.ptr_ + 0x10);
  if (actual_expression == (char *)0x0) {
    sVar3 = 6;
    actual_expression = "(null)";
  }
  else {
    sVar3 = strlen(actual_expression);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,actual_expression,sVar3);
  iVar2 = std::__cxx11::string::compare((char *)actual_value);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50.ptr_ + 0x10),"\n  Actual: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50.ptr_ + 0x10),(actual_value->_M_dataplus)._M_p,
               actual_value->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_50.ptr_ + 0x10),"\nExpected: ",0xb);
  poVar5 = (ostream *)(local_50.ptr_ + 0x10);
  if (expected_expression == (char *)0x0) {
    sVar3 = 6;
    expected_expression = "(null)";
  }
  else {
    sVar3 = strlen(expected_expression);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,expected_expression,sVar3);
  if (ignoring_case) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50.ptr_ + 0x10)," (ignoring case)",0x10);
  }
  iVar2 = std::__cxx11::string::compare((char *)expected_value);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50.ptr_ + 0x10),"\nWhich is: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_50.ptr_ + 0x10),(expected_value->_M_dataplus)._M_p,
               expected_value->_M_string_length);
  }
  local_40.success_ = false;
  local_40.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  other = AssertionResult::operator<<(&local_40,(Message *)&local_50);
  pAVar1 = local_48;
  AssertionResult::AssertionResult(local_48,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar4.ptr_ = extraout_RDX;
  if (local_50.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50.ptr_ + 8))();
    sVar4.ptr_ = extraout_RDX_00;
  }
  AVar6.message_.ptr_ = sVar4.ptr_;
  AVar6._0_8_ = pAVar1;
  return AVar6;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const std::string& expected_value,
                          const std::string& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}